

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O0

void __thiscall
icu_63::FieldPositionIteratorHandler::shiftLast(FieldPositionIteratorHandler *this,int32_t delta)

{
  UVector32 *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t i;
  int32_t delta_local;
  FieldPositionIteratorHandler *this_local;
  
  UVar2 = ::U_SUCCESS(this->status);
  if (((UVar2 != '\0') && (delta != 0)) && (iVar3 = UVector32::size(this->vec), 0 < iVar3)) {
    pUVar1 = this->vec;
    iVar4 = UVector32::elementAti(this->vec,iVar3 + -1);
    UVector32::setElementAt(pUVar1,delta + iVar4,iVar3 + -1);
    pUVar1 = this->vec;
    iVar4 = UVector32::elementAti(this->vec,iVar3 + -2);
    UVector32::setElementAt(pUVar1,delta + iVar4,iVar3 + -2);
  }
  return;
}

Assistant:

void
FieldPositionIteratorHandler::shiftLast(int32_t delta) {
  if (U_SUCCESS(status) && delta != 0) {
    int32_t i = vec->size();
    if (i > 0) {
      --i;
      vec->setElementAt(delta + vec->elementAti(i), i);
      --i;
      vec->setElementAt(delta + vec->elementAti(i), i);
    }
  }
}